

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VDotProdMultiAllReduce(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  sunrealtype dotprods [3];
  timespec spec_1;
  timespec local_88;
  undefined8 local_78;
  timespec local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (X->ops->nvdotprodmultiallreduce == (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0) {
    return 0;
  }
  local_58 = (double)param_2;
  local_48 = (double)N_VGetLength();
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0x4000000000000000,X);
  N_VConst(0x3fe0000000000000,*puVar4);
  iVar7 = 1;
  clock_gettime(1,&local_88);
  lVar5 = local_88.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_88.tv_nsec;
  iVar1 = N_VDotProdMultiLocal(1,X,puVar4,&local_88);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  if ((iVar1 == 0) && (iVar1 = SUNRCompare(local_88.tv_sec,(double)(long)local_58), iVar1 == 0)) {
    iVar7 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdMultiAllReduce Case 1 ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",(ulong)(uint)myid);
  }
  max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) - (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_68.tv_nsec;
  iVar1 = N_VDotProdMultiAllReduce(1,X,&local_88);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  if ((iVar1 == 0) && (iVar1 = SUNRCompare(local_88.tv_sec,(double)(long)local_48), iVar1 == 0)) {
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdMultiAllReduce Case 1 ");
    }
  }
  else {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",(ulong)(uint)myid);
    iVar7 = iVar7 + 1;
  }
  max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) - (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiAllReduce");
  }
  N_VConst(0x4000000000000000,X);
  N_VConst(0xbfe0000000000000,*puVar4);
  N_VConst(0x3fe0000000000000,puVar4[1]);
  N_VConst(0x3ff0000000000000,puVar4[2]);
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_68.tv_nsec;
  iVar1 = N_VDotProdMultiLocal(3,X,puVar4,&local_88);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  if (iVar1 == 0) {
    local_58 = (double)(long)local_58;
    uStack_50 = 0;
    iVar1 = SUNRCompare(local_88.tv_sec,-local_58);
    iVar2 = SUNRCompare(local_88.tv_nsec,local_58);
    iVar3 = SUNRCompare(local_78,local_58 + local_58);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_00110351;
    if (myid == 0) {
      puts("PASSED test -- N_VDotProdMultiLocal Case 2 ");
    }
  }
  else {
LAB_00110351:
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n",(ulong)(uint)myid);
    iVar7 = iVar7 + 1;
  }
  max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) - (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiLocal");
  }
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_68.tv_nsec;
  iVar1 = N_VDotProdMultiAllReduce(3,X,&local_88);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    local_48 = (double)(long)local_48;
    uStack_40 = 0;
    iVar1 = SUNRCompare(local_88.tv_sec,-local_48);
    iVar2 = SUNRCompare(local_88.tv_nsec,local_48);
    iVar3 = SUNRCompare(local_78,local_48 + local_48);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VDotProdMultiAllReduce Case 2 ");
      }
      goto LAB_001104bb;
    }
  }
  printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 2, Proc %d \n",(ulong)(uint)myid);
  iVar7 = iVar7 + 1;
LAB_001104bb:
  max_time(X,((double)local_68.tv_nsec / 1000000000.0 + (double)lVar6) -
             (dVar8 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VDotProdMultiAllReduce");
  }
  N_VDestroyVectorArray(puVar4,3);
  return iVar7;
}

Assistant:

int Test_N_VDotProdMultiAllReduce(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunindextype global_length;
  N_Vector* V;
  sunrealtype dotprods[3];

  /* only test if the operation is implemented, local vectors (non-MPI) do not
     provide this function */
  if (!(X->ops->nvdotprodmultiallreduce)) { return 0; }

  /* get global length */
  global_length = N_VGetLength(X);

  /* create vectors for testing */
  V = N_VCloneVectorArray(3, X);

  /*
   * Case 1: d[0] = z . V[0], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(HALF, V[0]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(1, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* perform the global reduction */
  start_time = get_time();
  ierr       = N_VDotProdMultiAllReduce(1, X, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[0] should equal the global vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)global_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiAllReduce", maxt);

  /*
   * Case 2: d[i] = z . V[i], N_VDotProd
   */

  /* fill vector data */
  N_VConst(TWO, X);
  N_VConst(NEG_HALF, V[0]);
  N_VConst(HALF, V[1]);
  N_VConst(ONE, V[2]);

  start_time = get_time();
  ierr       = N_VDotProdMultiLocal(3, X, V, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the local vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * local_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)local_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiLocal Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiLocal Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiLocal", maxt);

  /* perform the global reduction */
  start_time = get_time();
  ierr       = N_VDotProdMultiAllReduce(3, X, dotprods);
  sync_device(X);
  stop_time = get_time();

  /* dotprod[i] should equal -1, +1, and 2 times the global vector length */
  if (ierr == 0)
  {
    failure = SUNRCompare(dotprods[0], (sunrealtype)-1 * global_length);
    failure += SUNRCompare(dotprods[1], (sunrealtype)global_length);
    failure += SUNRCompare(dotprods[2], (sunrealtype)2 * global_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VDotProdMultiAllReduce Case 2, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VDotProdMultiAllReduce Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VDotProdMultiAllReduce", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(V, 3);

  return (fails);
}